

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O2

Hop_Obj_t * Hop_Oper(Hop_Man_t *p,Hop_Obj_t *p0,Hop_Obj_t *p1,Hop_Type_t Type)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p1_00;
  
  if (Type == AIG_EXOR) {
    pHVar1 = Hop_And(p,p0,(Hop_Obj_t *)((ulong)p1 ^ 1));
    p1_00 = Hop_And(p,(Hop_Obj_t *)((ulong)p0 ^ 1),p1);
    pHVar1 = Hop_Or(p,pHVar1,p1_00);
    return pHVar1;
  }
  if (Type == AIG_AND) {
    pHVar1 = Hop_And(p,p0,p1);
    return pHVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopOper.c"
                ,0x59,"Hop_Obj_t *Hop_Oper(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)");
}

Assistant:

Hop_Obj_t * Hop_Oper( Hop_Man_t * p, Hop_Obj_t * p0, Hop_Obj_t * p1, Hop_Type_t Type )
{
    if ( Type == AIG_AND )
        return Hop_And( p, p0, p1 );
    if ( Type == AIG_EXOR )
        return Hop_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}